

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_dict_big(void)

{
  int iVar1;
  uint uVar2;
  VALUE *pVVar3;
  size_t sVar4;
  char key [32];
  int i;
  VALUE *v;
  VALUE d;
  int N;
  VALUE *in_stack_000003d0;
  VALUE *in_stack_ffffffffffffffa8;
  bool local_4a;
  bool local_49;
  char *in_stack_ffffffffffffffb8;
  VALUE *in_stack_ffffffffffffffc0;
  VALUE *in_stack_ffffffffffffffc8;
  uint local_24;
  
  value_init_dict((VALUE *)0x10c3b6);
  for (local_24 = 0; (int)local_24 < 100000; local_24 = local_24 + 1) {
    sprintf(&stack0xffffffffffffffb8,"%d",(ulong)local_24);
    pVVar3 = value_dict_get_or_add(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_49 = false;
    if (pVVar3 != (VALUE *)0x0) {
      iVar1 = value_init_int32(in_stack_ffffffffffffffa8,0);
      local_49 = iVar1 == 0;
    }
    acutest_check_((int)(ulong)local_49,
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x346,"%s","v != NULL && value_init_int32(v, i) == 0");
  }
  sVar4 = value_dict_size(in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(sVar4 == 100000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x348,"%s","value_dict_size(&d) == N");
  for (local_24 = 0; (int)local_24 < 100000; local_24 = local_24 + 1) {
    sprintf(&stack0xffffffffffffffb8,"%d",(ulong)local_24);
    pVVar3 = value_dict_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_4a = false;
    if (pVVar3 != (VALUE *)0x0) {
      uVar2 = value_int32(in_stack_ffffffffffffffc8);
      local_4a = uVar2 == local_24;
    }
    acutest_check_((int)(ulong)local_4a,
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x34c,"%s","v != NULL && value_int32(v) == i");
  }
  iVar1 = value_dict_verify(in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x34e,"%s","value_dict_verify(&d) == 0");
  value_dict_clean(in_stack_000003d0);
  sVar4 = value_dict_size(in_stack_ffffffffffffffa8);
  acutest_check_((int)(ulong)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x350,"%s","value_dict_size(&d) == 0");
  value_fini((VALUE *)0x10c5c3);
  return;
}

Assistant:

static void
test_dict_big(void)
{
    const int N = 100000;

    VALUE d;
    VALUE* v;
    int i;
    char key[32];

    value_init_dict(&d);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get_or_add(&d, key);
        TEST_CHECK(v != NULL  &&  value_init_int32(v, i) == 0);
    }
    TEST_CHECK(value_dict_size(&d) == N);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get(&d, key);
        TEST_CHECK(v != NULL  &&  value_int32(v) == i);
    }
    TEST_CHECK(value_dict_verify(&d) == 0);
    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);
}